

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_ptr.hpp
# Opt level: O3

void __thiscall
nonstd::vptr::
value_ptr<(anonymous_namespace)::NoDefaultCopyMove,_nonstd::vptr::detail::default_clone<(anonymous_namespace)::NoDefaultCopyMove>,_std::default_delete<(anonymous_namespace)::NoDefaultCopyMove>_>
::~value_ptr(value_ptr<(anonymous_namespace)::NoDefaultCopyMove,_nonstd::vptr::detail::default_clone<(anonymous_namespace)::NoDefaultCopyMove>,_std::default_delete<(anonymous_namespace)::NoDefaultCopyMove>_>
             *this)

{
  pointer pNVar1;
  
  if (this != (value_ptr<(anonymous_namespace)::NoDefaultCopyMove,_nonstd::vptr::detail::default_clone<(anonymous_namespace)::NoDefaultCopyMove>,_std::default_delete<(anonymous_namespace)::NoDefaultCopyMove>_>
               *)0x0) {
    pNVar1 = (this->ptr).ptr;
    if (pNVar1 != (pointer)(this + 2)) {
      operator_delete(pNVar1,*(long *)(this + 2) + 1);
    }
  }
  operator_delete(this,0x20);
  return;
}

Assistant:

~value_ptr() = default;